

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_style_load_all_cursors(nk_context *ctx,nk_cursor *cursors)

{
  nk_style *style;
  int i;
  nk_cursor *cursors_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3a07,"void nk_style_load_all_cursors(struct nk_context *, struct nk_cursor *)")
    ;
  }
  if (ctx != (nk_context *)0x0) {
    for (style._4_4_ = 0; style._4_4_ < 7; style._4_4_ = style._4_4_ + 1) {
      (ctx->style).cursors[style._4_4_] = cursors + style._4_4_;
    }
    (ctx->style).cursor_visible = 1;
  }
  return;
}

Assistant:

NK_API void
nk_style_load_all_cursors(struct nk_context *ctx, struct nk_cursor *cursors)
{
    int i = 0;
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return;
    style = &ctx->style;
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        style->cursors[i] = &cursors[i];
    style->cursor_visible = nk_true;
}